

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Product.h
# Opt level: O2

optional<covenant::DFA<covenant::Sym>_> * __thiscall
covenant::Product<covenant::Sym>::intersect_all
          (optional<covenant::DFA<covenant::Sym>_> *__return_storage_ptr__,
          Product<covenant::Sym> *this,
          vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
          *reg_langs,uint alphstart,uint alphsz)

{
  pointer pDVar1;
  optional_base<covenant::DFA<covenant::Sym>_> *poVar2;
  size_type sVar3;
  ostream *poVar4;
  reference_type pDVar5;
  long lVar6;
  ulong uVar7;
  allocator local_2f1;
  optional_base<covenant::DFA<covenant::Sym>_> *local_2f0;
  uint local_2e8;
  uint local_2e4;
  optional<covenant::DFA<covenant::Sym>_> inter;
  optional<covenant::DFA<covenant::Sym>_> next;
  dfa_t prev;
  dfa_t reg_lang_1;
  dfa_t reg_lang_0;
  dfa_t reg_lang_i;
  
  local_2f0 = &__return_storage_ptr__->super_type;
  DFA<covenant::Sym>::makeDFA
            (&reg_lang_0,
             (reg_langs->
             super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
             )._M_impl.super__Vector_impl_data._M_start,alphstart,alphsz);
  local_2e8 = alphstart;
  local_2e4 = alphsz;
  DFA<covenant::Sym>::makeDFA
            (&reg_lang_1,
             (reg_langs->
             super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,alphstart,alphsz);
  if (avy::AvyLogFlag == '\x01') {
    std::__cxx11::string::string((string *)&inter,"verbose",(allocator *)&next);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)avy::AvyLog_abi_cxx11_,(key_type *)&inter);
    std::__cxx11::string::~string((string *)&inter);
    if (sVar3 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Automata 0 has ");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(int)(((long)reg_lang_0.trans.
                                              super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)reg_lang_0.trans.
                                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0x18));
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  if (avy::AvyLogFlag == '\x01') {
    std::__cxx11::string::string((string *)&inter,"verbose",(allocator *)&next);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)avy::AvyLog_abi_cxx11_,(key_type *)&inter);
    std::__cxx11::string::~string((string *)&inter);
    if (sVar3 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Automata 1 has ");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(int)(((long)reg_lang_1.trans.
                                              super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)reg_lang_1.trans.
                                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0x18));
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  DFA<covenant::Sym>::intersection(&inter,&reg_lang_0,&reg_lang_1);
  if (inter.super_type.m_initialized == true) {
    pDVar5 = boost::optional<covenant::DFA<covenant::Sym>_>::get(&inter);
    DFA<covenant::Sym>::DFA(&prev,pDVar5);
    uVar7 = 2;
    while( true ) {
      pDVar1 = (reg_langs->
               super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)(reg_langs->
                    super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1;
      if ((ulong)(lVar6 / 0x70) <= uVar7) break;
      DFA<covenant::Sym>::makeDFA(&reg_lang_i,pDVar1 + uVar7,local_2e8,local_2e4);
      if (avy::AvyLogFlag == '\x01') {
        std::__cxx11::string::string((string *)&next.super_type,"verbose",&local_2f1);
        sVar3 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)avy::AvyLog_abi_cxx11_,(key_type *)&next.super_type);
        std::__cxx11::string::~string((string *)&next.super_type);
        if (sVar3 != 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Automata ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4," has ");
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             (poVar4,(int)(((long)reg_lang_i.trans.
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)reg_lang_i.trans.
                                                 super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18))
          ;
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      }
      DFA<covenant::Sym>::intersection
                ((optional<covenant::DFA<covenant::Sym>_> *)&next.super_type,&prev,&reg_lang_i);
      if (next.super_type.m_initialized == false) {
        boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
                  (&next.super_type);
        DFA<covenant::Sym>::~DFA(&reg_lang_i);
        DFA<covenant::Sym>::~DFA(&prev);
        goto LAB_00151dbb;
      }
      pDVar5 = boost::optional<covenant::DFA<covenant::Sym>_>::get
                         ((optional<covenant::DFA<covenant::Sym>_> *)&next.super_type);
      DFA<covenant::Sym>::operator=(&prev,pDVar5);
      boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
                (&next.super_type);
      DFA<covenant::Sym>::~DFA(&reg_lang_i);
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::optional_base
              (local_2f0,&prev,lVar6 % 0x70);
    DFA<covenant::Sym>::~DFA(&prev);
  }
  else {
LAB_00151dbb:
    ((type *)&local_2f0->m_initialized)->m_initialized = false;
  }
  poVar2 = local_2f0;
  boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
            (&inter.super_type);
  DFA<covenant::Sym>::~DFA(&reg_lang_1);
  DFA<covenant::Sym>::~DFA(&reg_lang_0);
  return (optional<covenant::DFA<covenant::Sym>_> *)poVar2;
}

Assistant:

boost::optional<dfa_t> intersect_all(const vector<dfa_t>& reg_langs, 
                                       unsigned int alphstart, 
                                       unsigned int alphsz)
  {
    dfa_t reg_lang_0 = reg_langs[0].makeDFA (alphstart, alphsz);
    dfa_t reg_lang_1 = reg_langs[1].makeDFA (alphstart, alphsz);

    LOG("verbose", std::cout << "Automata 0 has " << reg_lang_0.nStates() << endl);
    LOG("verbose", std::cout << "Automata 1 has " << reg_lang_1.nStates() << endl);

    boost::optional<dfa_t> inter  = dfa_t::intersection(reg_lang_0, reg_lang_1);
    bool result = (inter ? true : false);
    if (result)
    {
      dfa_t prev = *inter;

      for(unsigned int i=2; i < reg_langs.size(); i++)
      {
        dfa_t reg_lang_i = reg_langs[i].makeDFA (alphstart, alphsz);

        LOG ("verbose", 
             cout << "Automata " << i << " has " << reg_lang_i.nStates() << endl);

        boost::optional<dfa_t> next = dfa_t::intersection(prev, reg_lang_i);

        result &= (next ? true : false);

        if (!result)
          break;
        
        prev = *next;
      }

      if (result)
        return boost::optional<dfa_t> (prev);
    }
    return boost::optional<dfa_t> ();
  }